

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCheck.c
# Opt level: O2

int Abc_NtkCompareSignals(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fOnlyPis,int fComb)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  char *__format;
  uint i;
  
  Abc_NtkOrderObjsByName(pNtk1,fComb);
  Abc_NtkOrderObjsByName(pNtk2,fComb);
  iVar1 = pNtk1->vPis->nSize;
  if (iVar1 != pNtk2->vPis->nSize) {
    puts("Networks have different number of primary inputs.");
    return 0;
  }
  for (i = 0; (int)i < iVar1; i = i + 1) {
    pAVar2 = Abc_NtkPi(pNtk1,i);
    pcVar3 = Abc_ObjName(pAVar2);
    pAVar4 = Abc_NtkPi(pNtk2,i);
    pcVar5 = Abc_ObjName(pAVar4);
    iVar1 = strcmp(pcVar3,pcVar5);
    if (iVar1 != 0) {
      pcVar3 = Abc_ObjName(pAVar2);
      pAVar2 = Abc_NtkPi(pNtk2,i);
      pcVar5 = Abc_ObjName(pAVar2);
      __format = 
      "Primary input #%d is different in network 1 ( \"%s\") and in network 2 (\"%s\").\n";
      goto LAB_0069b060;
    }
    iVar1 = pNtk1->vPis->nSize;
  }
  if (fOnlyPis == 0) {
    iVar1 = Abc_NtkCompareBoxes(pNtk1,pNtk2,fComb);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = pNtk1->vPos->nSize;
    if (iVar1 != pNtk2->vPos->nSize) {
      puts("Networks have different number of primary outputs.");
      return 0;
    }
    for (i = 0; (int)i < iVar1; i = i + 1) {
      pAVar2 = Abc_NtkPo(pNtk1,i);
      pcVar3 = Abc_ObjName(pAVar2);
      pAVar4 = Abc_NtkPo(pNtk2,i);
      pcVar5 = Abc_ObjName(pAVar4);
      iVar1 = strcmp(pcVar3,pcVar5);
      if (iVar1 != 0) {
        pcVar3 = Abc_ObjName(pAVar2);
        pAVar2 = Abc_NtkPo(pNtk2,i);
        pcVar5 = Abc_ObjName(pAVar2);
        __format = 
        "Primary output #%d is different in network 1 ( \"%s\") and in network 2 (\"%s\").\n";
LAB_0069b060:
        printf(__format,(ulong)i,pcVar3,pcVar5);
        return 0;
      }
      iVar1 = pNtk1->vPos->nSize;
    }
  }
  return 1;
}

Assistant:

int Abc_NtkCompareSignals( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fOnlyPis, int fComb )
{
    Abc_NtkOrderObjsByName( pNtk1, fComb );
    Abc_NtkOrderObjsByName( pNtk2, fComb );
    if ( !Abc_NtkComparePis( pNtk1, pNtk2, fComb ) )
        return 0;
    if ( !fOnlyPis )
    {
        if ( !Abc_NtkCompareBoxes( pNtk1, pNtk2, fComb ) )
            return 0;
        if ( !Abc_NtkComparePos( pNtk1, pNtk2, fComb ) )
            return 0;
    }
    return 1;
}